

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanObjectWrappers.hpp
# Opt level: O1

VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14> * __thiscall
VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>
::operator=(VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14> *this
           ,VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14> *rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  Release(this);
  peVar1 = (rhs->m_pLogicalDevice).
           super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var2 = (rhs->m_pLogicalDevice).
           super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (rhs->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (rhs->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_pLogicalDevice).
            super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  (this->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this->m_VkObject = rhs->m_VkObject;
  rhs->m_VkObject = (VkDescriptorPool_T *)0x0;
  return this;
}

Assistant:

VulkanObjectWrapper& operator=(VulkanObjectWrapper&& rhs) noexcept
    {
        Release();
        m_pLogicalDevice = std::move(rhs.m_pLogicalDevice);
        m_VkObject       = rhs.m_VkObject;
        rhs.m_VkObject   = VK_NULL_HANDLE;
        return *this;
    }